

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Value __thiscall
Catch::RunContext::acceptExpression
          (RunContext *this,ExpressionResultBuilder *assertionResult,AssertionInfo *assertionInfo)

{
  Value VVar1;
  AssertionResult local_d8;
  AssertionInfo *local_20;
  AssertionInfo *assertionInfo_local;
  ExpressionResultBuilder *assertionResult_local;
  RunContext *this_local;
  
  local_20 = assertionInfo;
  assertionInfo_local = (AssertionInfo *)assertionResult;
  assertionResult_local = (ExpressionResultBuilder *)this;
  AssertionInfo::operator=(&this->m_lastAssertionInfo,assertionInfo);
  ExpressionResultBuilder::buildResult
            (&local_d8,(ExpressionResultBuilder *)assertionInfo_local,local_20);
  VVar1 = actOnCurrentResult(this,&local_d8);
  AssertionResult::~AssertionResult(&local_d8);
  return VVar1;
}

Assistant:

virtual ResultAction::Value acceptExpression( ExpressionResultBuilder const& assertionResult, AssertionInfo const& assertionInfo ) {
            m_lastAssertionInfo = assertionInfo;
            return actOnCurrentResult( assertionResult.buildResult( assertionInfo ) );
        }